

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_send_body(http_s *r,void *data,uintptr_t length)

{
  FIOBJ key;
  int iVar1;
  FIOBJ FVar2;
  FIOBJ obj;
  
  iVar1 = -1;
  if ((r != (http_s *)0x0) && (((r->method != 0 || (r->status_str != 0)) || (r->status == 0)))) {
    if (data != (void *)0x0 && length != 0) {
      if (add_content_length_cl_hash == 0) {
        add_content_length_cl_hash = fio_siphash13("content-length",0xe,0x1456f2,0x145bc9);
      }
      FVar2 = fiobj_hash_get2((r->private_data).out_headers,add_content_length_cl_hash);
      key = HTTP_HEADER_CONTENT_LENGTH;
      if (FVar2 == 0) {
        FVar2 = (r->private_data).out_headers;
        if ((long)(length + 0x4000000000000000) < 0) {
          obj = fiobj_num_new_bignum(length);
        }
        else {
          obj = (length * 2 | length & 0x8000000000000000) + 1;
        }
        fiobj_hash_set(FVar2,key,obj);
      }
      add_date(r);
      iVar1 = (**(r->private_data).vtbl)(r,data,length);
      return iVar1;
    }
    http_finish(r);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int http_send_body(http_s *r, void *data, uintptr_t length) {
  if (HTTP_INVALID_HANDLE(r))
    return -1;
  if (!length || !data) {
    http_finish(r);
    return 0;
  }
  add_content_length(r, length);
  // add_content_type(r);
  add_date(r);
  return ((http_vtable_s *)r->private_data.vtbl)
      ->http_send_body(r, data, length);
}